

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc.cc
# Opt level: O2

void absl::lts_20250127::crc_internal::CRCImpl::FillWordTable
               (uint32_t poly,uint32_t last,int word_size,Uint32By256 *t)

{
  uint32_t *puVar1;
  int i;
  uint uVar2;
  ulong uVar3;
  uint32_t uVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  uint32_t *puVar8;
  long lVar9;
  bool bVar10;
  
  puVar1 = *t + 1;
  for (uVar5 = 0; uVar5 != (uint)word_size; uVar5 = uVar5 + 1) {
    t[uVar5][0] = 0;
    for (uVar2 = 0x80; uVar2 != 0; uVar2 = uVar2 >> 1) {
      if (uVar2 == 0x80 && uVar5 == 0) {
        t[uVar5][0x80] = last;
      }
      else {
        puVar8 = t[uVar5] + uVar2 * 2;
        if (uVar2 == 0x80) {
          puVar8 = (t + uVar5)[-1] + 1;
        }
        uVar4 = *puVar8 >> 1;
        if ((*puVar8 & 1) != 0) {
          uVar4 = uVar4 ^ poly;
        }
        t[uVar5][uVar2] = uVar4;
      }
    }
    uVar7 = 2;
    while (iVar6 = (int)uVar7, iVar6 != 0x100) {
      uVar3 = (ulong)iVar6;
      uVar7 = (ulong)(uint)(iVar6 * 2);
      lVar9 = ~uVar3 + uVar7;
      puVar8 = puVar1;
      while (bVar10 = lVar9 != 0, lVar9 = lVar9 + -1, bVar10) {
        puVar8[uVar3] = *puVar8 ^ t[uVar5][uVar3];
        puVar8 = puVar8 + 1;
      }
    }
    puVar1 = puVar1 + 0x100;
  }
  return;
}

Assistant:

void CRCImpl::FillWordTable(uint32_t poly, uint32_t last, int word_size,
                            Uint32By256* t) {
  for (int j = 0; j != word_size; j++) {  // for each byte of extension....
    t[j][0] = 0;                          // a zero has no effect
    for (int i = 128; i != 0; i >>= 1) {  // fill in entries for powers of 2
      if (j == 0 && i == 128) {
        t[j][i] = last;  // top bit in last byte is given
      } else {
        // each successive power of two is derived from the previous
        // one, either in this table, or the last table
        uint32_t pred;
        if (i == 128) {
          pred = t[j - 1][1];
        } else {
          pred = t[j][i << 1];
        }
        // Advance the CRC by one bit (multiply by X, and take remainder
        // through one step of polynomial long division)
        if (pred & 1) {
          t[j][i] = (pred >> 1) ^ poly;
        } else {
          t[j][i] = pred >> 1;
        }
      }
    }
    // CRCs have the property that CRC(a xor b) == CRC(a) xor CRC(b)
    // so we can make all the tables for non-powers of two by
    // xoring previously created entries.
    for (int i = 2; i != 256; i <<= 1) {
      for (int k = i + 1; k != (i << 1); k++) {
        t[j][k] = t[j][i] ^ t[j][k - i];
      }
    }
  }
}